

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_core.c
# Opt level: O3

void grasshopper_encrypt_block
               (grasshopper_round_keys_t *subkeys,grasshopper_w128_t *source,
               grasshopper_w128_t *target,grasshopper_w128_t *buffer)

{
  byte bVar1;
  long lVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  
  uVar3 = source->q[0];
  target->q[0] = uVar3;
  uVar4 = source->q[1];
  target->q[1] = uVar4;
  lVar2 = 0;
  do {
    target->q[0] = uVar3 ^ subkeys->k[lVar2].q[0];
    target->q[1] = uVar4 ^ *(ulong *)((long)subkeys->k + lVar2 * 0x10 + 8);
    buffer->q[0] = 0;
    buffer->q[1] = 0;
    lVar6 = 0;
    uVar3 = 0;
    uVar7 = 0;
    lVar5 = 0x17f758;
    do {
      bVar1 = target->b[lVar6];
      uVar3 = uVar3 ^ *(ulong *)(lVar5 + -8 + (ulong)bVar1 * 0x10);
      buffer->q[0] = uVar3;
      uVar7 = uVar7 ^ *(ulong *)(lVar5 + (ulong)bVar1 * 0x10);
      buffer->q[1] = uVar7;
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x1000;
    } while (lVar6 != 0x10);
    target->q[0] = uVar3;
    uVar4 = buffer->q[1];
    target->q[1] = uVar4;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 9);
  target->q[0] = uVar3 ^ subkeys->k[9].q[0];
  target->q[1] = uVar4 ^ *(ulong *)((long)subkeys->k + 0x98);
  return;
}

Assistant:

void grasshopper_encrypt_block(grasshopper_round_keys_t* subkeys, grasshopper_w128_t* source,
                               grasshopper_w128_t* target, grasshopper_w128_t* buffer) {
    int i;
    grasshopper_copy128(target, source);

    for (i = 0; i < 9; i++) {
        grasshopper_append128(target, &subkeys->k[i]);
        grasshopper_append128multi(buffer, target, grasshopper_pil_enc128);
    }

    grasshopper_append128(target, &subkeys->k[9]);
}